

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_address.cc
# Opt level: O3

raptor_error
raptor_blocking_resolve_address(char *name,char *default_port,raptor_resolved_addresses **addresses)

{
  _Head_base<0UL,_char_*,_false> _Var1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  long *plVar5;
  void *pvVar6;
  long *in_RCX;
  addrinfo *paVar7;
  bool bVar8;
  size_t size;
  long lVar9;
  long lVar10;
  bool bVar11;
  StringView name_00;
  UniquePtr<char> port;
  UniquePtr<char> host;
  addrinfo *result;
  _Head_base<0UL,_char_*,_false> local_90;
  RefCountedPtr<raptor::Status> local_88;
  _Head_base<0UL,_char_*,_false> local_80;
  addrinfo *local_78;
  char *local_70;
  addrinfo local_68;
  
  sVar3 = 0;
  local_78 = (addrinfo *)0x0;
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  local_80._M_head_impl = (char *)0x0;
  local_90._M_head_impl = (char *)0x0;
  local_70 = default_port;
  if (default_port != (char *)0x0) {
    sVar3 = strlen(default_port);
  }
  name_00._size = sVar3;
  name_00._ptr = default_port;
  raptor::SplitHostPort(name_00,(UniquePtr<char> *)&local_80,(UniquePtr<char> *)&local_90);
  if (local_80._M_head_impl == (char *)0x0) {
    raptor::MakeStatusFromFormat<char_const(&)[27],char_const*&>
              ((raptor *)&local_88,(char (*) [27])"unparseable host:port (%s)",&local_70);
  }
  else {
    if (local_90._M_head_impl == (char *)0x0) {
      if (addresses == (raptor_resolved_addresses **)0x0) {
        raptor::MakeStatusFromFormat<char_const(&)[21],char_const*&>
                  ((raptor *)&local_88,(char (*) [21])"no port in name (%s)",&local_70);
        goto LAB_0010bcf4;
      }
      pcVar4 = raptor_strdup((char *)addresses);
      _Var1._M_head_impl = local_90._M_head_impl;
      bVar11 = local_90._M_head_impl != (char *)0x0;
      local_90._M_head_impl = pcVar4;
      if (bVar11) {
        raptor::Free(_Var1._M_head_impl);
      }
    }
    local_68.ai_canonname = (char *)0x0;
    local_68.ai_next = (addrinfo *)0x0;
    local_68.ai_addrlen = 0;
    local_68._20_4_ = 0;
    local_68.ai_addr = (sockaddr *)0x0;
    local_68.ai_socktype = 1;
    local_68.ai_protocol = 0;
    local_68.ai_flags = 1;
    local_68.ai_family = 0;
    iVar2 = getaddrinfo(local_80._M_head_impl,local_90._M_head_impl,&local_68,&local_78);
    _Var1._M_head_impl = local_90._M_head_impl;
    if (iVar2 == 0) {
LAB_0010bc44:
      plVar5 = (long *)raptor::Malloc(0x10);
      *in_RCX = (long)plVar5;
      *plVar5 = 0;
      size = 0;
      if (local_78 != (addrinfo *)0x0) {
        lVar10 = 0;
        paVar7 = local_78;
        do {
          lVar10 = lVar10 + 1;
          paVar7 = paVar7->ai_next;
          size = size + 0x84;
        } while (paVar7 != (addrinfo *)0x0);
        *plVar5 = lVar10;
      }
      pvVar6 = raptor::Malloc(size);
      *(void **)(*in_RCX + 8) = pvVar6;
      if (local_78 != (addrinfo *)0x0) {
        lVar10 = *(long *)(*in_RCX + 8);
        lVar9 = 0;
        paVar7 = local_78;
        do {
          memcpy((void *)(lVar10 + lVar9),paVar7->ai_addr,(ulong)paVar7->ai_addrlen);
          lVar10 = *(long *)(*in_RCX + 8);
          *(socklen_t *)(lVar10 + 0x80 + lVar9) = paVar7->ai_addrlen;
          paVar7 = paVar7->ai_next;
          lVar9 = lVar9 + 0x84;
        } while (paVar7 != (addrinfo *)0x0);
      }
      name[0] = '\0';
      name[1] = '\0';
      name[2] = '\0';
      name[3] = '\0';
      name[4] = '\0';
      name[5] = '\0';
      name[6] = '\0';
      name[7] = '\0';
      goto LAB_0010bd06;
    }
    lVar10 = 0;
    bVar11 = true;
    do {
      bVar8 = bVar11;
      iVar2 = strcmp(_Var1._M_head_impl,(&PTR_anon_var_dwarf_353bd_001178b0)[lVar10 * 2]);
      if (iVar2 == 0) {
        iVar2 = getaddrinfo(local_80._M_head_impl,(&PTR_anon_var_dwarf_353d3_001178b8)[lVar10 * 2],
                            &local_68,&local_78);
        if (iVar2 == 0) goto LAB_0010bc44;
        break;
      }
      lVar10 = 1;
      bVar11 = false;
    } while (bVar8);
    raptor::MakeStatusFromPosixError((raptor *)&local_88,"getaddrinfo");
  }
LAB_0010bcf4:
  *(Status **)name = local_88._value;
LAB_0010bd06:
  local_88._value = (Status *)0x0;
  raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr(&local_88);
  if (local_78 != (addrinfo *)0x0) {
    freeaddrinfo(local_78);
  }
  std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr
            ((unique_ptr<char,_raptor::DefaultDeleteChar> *)&local_90);
  std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr
            ((unique_ptr<char,_raptor::DefaultDeleteChar> *)&local_80);
  return (raptor_error)(Status *)name;
}

Assistant:

raptor_error raptor_blocking_resolve_address(
                                const char* name,
                                const char* default_port,
                                raptor_resolved_addresses** addresses) {

    struct addrinfo hints;
    struct addrinfo *result = nullptr, *resp;
    int s;
    size_t i;
    raptor_error err = RAPTOR_ERROR_NONE;

    /* parse name, splitting it into host and port parts */
    raptor::UniquePtr<char> host;
    raptor::UniquePtr<char> port;
    raptor::SplitHostPort(name, &host, &port);

    if (host == nullptr) {
        err = RAPTOR_ERROR_FROM_FORMAT("unparseable host:port (%s)", name);
        goto done;
    }

    if (port == nullptr) {
        if (default_port == nullptr) {
            err = RAPTOR_ERROR_FROM_FORMAT("no port in name (%s)", name);
            goto done;
        }
        port.reset(raptor_strdup(default_port));
    }

    /* Call getaddrinfo */
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;     /* ipv4 or ipv6 */
    hints.ai_socktype = SOCK_STREAM; /* stream socket */
    hints.ai_flags = AI_PASSIVE;     /* for wildcard IP address */

    s = getaddrinfo(host.get(), port.get(), &hints, &result);
    if (s != 0) {
        /* Retry if well-known service name is recognized */
        const char* svc[][2] = {{"http", "80"}, {"https", "443"}};
        for (i = 0; i < RAPTOR_ARRAY_SIZE(svc); i++) {
            if (strcmp(port.get(), svc[i][0]) == 0) {
                s = getaddrinfo(host.get(), svc[i][1], &hints, &result);
                break;
            }
        }
    }

    if (s != 0) {
        err = RAPTOR_POSIX_ERROR("getaddrinfo");
        goto done;
    }

    /* Success path: set addrs non-NULL, fill it in */
    *addresses = static_cast<raptor_resolved_addresses*>(
        raptor::Malloc(sizeof(raptor_resolved_addresses)));
    (*addresses)->naddrs = 0;
    for (resp = result; resp != nullptr; resp = resp->ai_next) {
        (*addresses)->naddrs++;
    }
    (*addresses)->addrs = static_cast<raptor_resolved_address*>(
        raptor::Malloc(sizeof(raptor_resolved_address) * (*addresses)->naddrs));

    i = 0;
    for (resp = result; resp != nullptr; resp = resp->ai_next) {
        memcpy(&(*addresses)->addrs[i].addr, resp->ai_addr, resp->ai_addrlen);
        (*addresses)->addrs[i].len = resp->ai_addrlen;
        i++;
    }
    err = RAPTOR_ERROR_NONE;
done:
    if (result) {
        freeaddrinfo(result);
    }
    return err;
}